

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"---- string conversion");
  std::endl<char,std::char_traits<char>>(poVar1);
  string_conversion_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- os wrapper");
  std::endl<char,std::char_traits<char>>(poVar1);
  os_wrapper_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- fopen");
  std::endl<char,std::char_traits<char>>(poVar1);
  fopen_wrapper_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- getenv");
  std::endl<char,std::char_traits<char>>(poVar1);
  getenv_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- utf8");
  std::endl<char,std::char_traits<char>>(poVar1);
  to_utf8_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- utf16");
  std::endl<char,std::char_traits<char>>(poVar1);
  to_utf16_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- utf8_to_ascii");
  std::endl<char,std::char_traits<char>>(poVar1);
  utf8_to_ascii_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- transcoding");
  std::endl<char,std::char_traits<char>>(poVar1);
  transcoding_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- whoami");
  std::endl<char,std::char_traits<char>>(poVar1);
  get_whoami_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- file");
  std::endl<char,std::char_traits<char>>(poVar1);
  same_file_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- path");
  std::endl<char,std::char_traits<char>>(poVar1);
  path_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- read from file");
  std::endl<char,std::char_traits<char>>(poVar1);
  read_from_file_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- hex encode/decode");
  std::endl<char,std::char_traits<char>>(poVar1);
  hex_encode_decode_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- rename/delete");
  std::endl<char,std::char_traits<char>>(poVar1);
  rename_delete_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- timestamp");
  std::endl<char,std::char_traits<char>>(poVar1);
  timestamp_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- is_long_long");
  std::endl<char,std::char_traits<char>>(poVar1);
  is_long_long_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- memory usage");
  std::endl<char,std::char_traits<char>>(poVar1);
  memory_usage_test();
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    try {
        std::cout << "---- string conversion" << std::endl;
        string_conversion_test();
        std::cout << "---- os wrapper" << std::endl;
        os_wrapper_test();
        std::cout << "---- fopen" << std::endl;
        fopen_wrapper_test();
        std::cout << "---- getenv" << std::endl;
        getenv_test();
        std::cout << "---- utf8" << std::endl;
        to_utf8_test();
        std::cout << "---- utf16" << std::endl;
        to_utf16_test();
        std::cout << "---- utf8_to_ascii" << std::endl;
        utf8_to_ascii_test();
        std::cout << "---- transcoding" << std::endl;
        transcoding_test();
        std::cout << "---- whoami" << std::endl;
        get_whoami_test();
        std::cout << "---- file" << std::endl;
        same_file_test();
        std::cout << "---- path" << std::endl;
        path_test();
        std::cout << "---- read from file" << std::endl;
        read_from_file_test();
        std::cout << "---- hex encode/decode" << std::endl;
        hex_encode_decode_test();
        std::cout << "---- rename/delete" << std::endl;
        rename_delete_test();
        std::cout << "---- timestamp" << std::endl;
        timestamp_test();
        std::cout << "---- is_long_long" << std::endl;
        is_long_long_test();
        std::cout << "---- memory usage" << std::endl;
        memory_usage_test();
    } catch (std::exception& e) {
        std::cout << "unexpected exception: " << e.what() << std::endl;
    }

    return 0;
}